

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

target_ulong helper_extp_mips64(target_ulong ac,target_ulong size,CPUMIPSState_conflict5 *env)

{
  target_ulong tVar1;
  target_ulong tVar2;
  byte bVar3;
  target_ulong tVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = (uint)size & 0x1f;
  tVar1 = (env->active_tc).DSPControl;
  uVar7 = (uint)tVar1;
  if ((uVar7 & 0x7f) < uVar6) {
    (env->active_tc).DSPControl = (ulong)(uVar7 | 0x4000);
    return 0;
  }
  tVar2 = (env->active_tc).HI[ac];
  tVar4 = (env->active_tc).LO[ac];
  bVar3 = (byte)uVar6;
  bVar5 = bVar3 ^ 0x1f;
  (env->active_tc).DSPControl = (ulong)(uVar7 & 0xffffbfff);
  return (ulong)((uint)((int)(((ulong)(uint)tVar4 | tVar2 << 0x20) >>
                             (((byte)tVar1 & 0x7f) - bVar3 & 0x3f)) << bVar5) >> bVar5);
}

Assistant:

target_ulong helper_extp(target_ulong ac, target_ulong size, CPUMIPSState *env)
{
    int32_t start_pos;
    int sub;
    uint32_t temp;
    uint64_t acc;

    size = size & 0x1F;

    temp = 0;
    start_pos = get_DSPControl_pos(env);
    sub = start_pos - (size + 1);
    if (sub >= -1) {
        acc = ((uint64_t)env->active_tc.HI[ac] << 32) |
              ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);
        temp = (acc >> (start_pos - size)) & (~0U >> (31 - size));
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return (target_ulong)temp;
}